

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_coordinator_unittest.cpp
# Opt level: O2

void __thiscall HostCoordinator_alignment_Test::TestBody(HostCoordinator_alignment_Test *this)

{
  return;
}

Assistant:

TEST(HostCoordinator, alignment) {
    using namespace memory;
    static_assert(
      HostCoordinator<double, AlignedAllocator<double,64>>::alignment() == 64,
      "bad alignment reported by Host Allocator");
    static_assert(
      HostCoordinator<double, AlignedAllocator<double,128>>::alignment() == 128,
      "bad alignment reported by Host Allocator");
    static_assert(
      HostCoordinator<double, AlignedAllocator<double,256>>::alignment() == 256,
      "bad alignment reported by Host Allocator");
    static_assert(
      HostCoordinator<double, AlignedAllocator<double,512>>::alignment() == 512,
      "bad alignment reported by Host Allocator");
}